

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O2

void __thiscall Debugger::EnterDebugMode(Debugger *this)

{
  bool bVar1;
  bool bVar2;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  EmmyFacade *this_00;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  value_type evalContext;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> lockEval;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_80;
  unique_lock<std::mutex> local_70;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2> local_50;
  unique_lock<std::mutex> local_40;
  
  std::unique_lock<std::mutex>::unique_lock(&local_70,&this->runMtx);
  this->blocking = true;
  while( true ) {
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->evalMtx);
    p_Var4 = &((this->evalQueue).c.
               super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur)->
              super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>;
    p_Var3 = &((this->evalQueue).c.
               super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
              super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>;
    if ((p_Var3 == p_Var4) && (this->blocking == true)) {
      std::unique_lock<std::mutex>::unlock(&local_40);
      std::condition_variable::wait((unique_lock *)&this->cvRun);
      std::unique_lock<std::mutex>::lock(&local_40);
      p_Var4 = &((this->evalQueue).c.
                 super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 = &((this->evalQueue).c.
                 super__Deque_base<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur)->
                super___shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (p_Var3 == p_Var4) break;
    std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_80,p_Var4);
    std::deque<std::shared_ptr<EvalContext>,_std::allocator<std::shared_ptr<EvalContext>_>_>::
    pop_front(&(this->evalQueue).c);
    std::unique_lock<std::mutex>::unlock(&local_40);
    bVar1 = this->skipHook;
    this->skipHook = true;
    std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,&local_80);
    bVar2 = DoEval(this,(shared_ptr<EvalContext> *)&local_50);
    (local_80._M_ptr)->success = bVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    this->skipHook = bVar1;
    this_00 = EmmyFacade::Get();
    std::__shared_ptr<EvalContext,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_60,&local_80);
    EmmyFacade::OnEvalResult(this_00,(shared_ptr<EvalContext> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  ClearCache(this);
  std::unique_lock<std::mutex>::~unique_lock(&local_70);
  return;
}

Assistant:

void Debugger::EnterDebugMode() {
	std::unique_lock<std::mutex> lock(runMtx);

	blocking = true;
	while (true) {
		std::unique_lock<std::mutex> lockEval(evalMtx);
		if (evalQueue.empty() && blocking) {
			lockEval.unlock();
			cvRun.wait(lock);
			lockEval.lock();
		}
		if (!evalQueue.empty()) {
			const auto evalContext = evalQueue.front();
			evalQueue.pop();
			lockEval.unlock();
			const bool skip = skipHook;
			skipHook = true;
			evalContext->success = DoEval(evalContext);
			skipHook = skip;
			EmmyFacade::Get().OnEvalResult(evalContext);
			continue;
		}
		break;
	}
	ClearCache();
}